

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

bool __thiscall Js::JavascriptPromise::WillRejectionBeUnhandled(JavascriptPromise *this)

{
  NodeBase **this_00;
  JavascriptPromiseReaction *pJVar1;
  Var aValue;
  RecyclableObject *obj;
  FunctionInfo *pFVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  JavascriptPromise *pJVar10;
  Type *pTVar11;
  JavascriptFunction *pJVar12;
  undefined1 local_b8 [8];
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  visited;
  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> stack;
  Iterator it;
  JavascriptPromise *p;
  
  bVar6 = true;
  if (this->isHandled == true) {
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _16_8_ = &Memory::HeapAllocator::Instance;
    visited.stats = (DictionaryStats *)&PTR_IsReadOnly_013cbf90;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    buffer._0_4_ = 0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    alloc = (Type)0x400000000;
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                       *)local_b8,&Memory::HeapAllocator::Instance);
    stack.list._40_8_ = this;
    JsUtil::
    List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)&visited.stats,(JavascriptPromise **)&stack.list.field_0x28);
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
           *)local_b8,this,1);
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    this_00 = &it.current;
    bVar6 = false;
LAB_00b9e666:
    if ((bVar6 == false) &&
       ((int)stack.list.
             super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
             buffer != 0)) {
      pJVar10 = JsUtil::
                Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
                          ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
                            *)&visited.stats);
      stack.list._40_8_ = (pJVar10->reactions).ptr;
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                stack.list._40_8_;
LAB_00b9e68f:
      do {
        if (it.list ==
            (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_00b9e897;
          *puVar9 = 0;
        }
        uVar4 = stack.list._40_8_;
        SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)this_00);
        if (it.current == (NodeBase *)uVar4) goto LAB_00b9e666;
        SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)this_00);
        it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  it.current;
        pTVar11 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::
                  Iterator::Data((Iterator *)&stack.list.field_0x28);
        pJVar1 = pTVar11->rejectReaction;
        aValue = (((pJVar1->capabilities).ptr)->promise).ptr;
        bVar5 = VarIs<Js::JavascriptPromise>(aValue);
      } while (!bVar5);
      it.current = (NodeBase *)VarTo<Js::JavascriptPromise>(aValue);
      if (((JavascriptPromise *)it.current)->isHandled == false) {
        obj = (pJVar1->handler).ptr;
        bVar5 = VarIsImpl<Js::JavascriptFunction>(obj);
        if (bVar5) {
          pJVar12 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
          pFVar2 = (pJVar12->functionInfo).ptr;
          iVar7 = (*(pJVar12->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(pJVar12);
          if ((iVar7 == 0) &&
             ((((((((((((pJVar12->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->throwerFunction).ptr)->functionInfo).
              ptr != (FunctionInfo *)EntryInfo::Thrower)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                        ,0x541,
                                        "(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower)"
                                        ,"unexpected FunctionInfo for thrower function!");
            if (!bVar5) goto LAB_00b9e897;
            *puVar9 = 0;
          }
          if (pFVar2 == (FunctionInfo *)EntryInfo::Thrower) {
            bVar6 = true;
            goto LAB_00b9e666;
          }
        }
      }
      BVar8 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              ::HasEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                          *)local_b8,(JavascriptPromise *)it.current);
      if (BVar8 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                    ,0x54e,"(visited.HasEntry(p) == false)",
                                    "Unexpected cycle in promise reaction tree!");
        if (!bVar5) {
LAB_00b9e897:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      BVar8 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              ::HasEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                          *)local_b8,(JavascriptPromise *)it.current);
      if (BVar8 == 0) {
        JsUtil::
        List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)&visited.stats,(JavascriptPromise **)this_00);
        SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
        ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
               *)local_b8,(JavascriptPromise *)it.current,1);
      }
      goto LAB_00b9e68f;
    }
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::~SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                        *)local_b8);
    JsUtil::
    List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)&visited.stats);
  }
  return bVar6;
}

Assistant:

bool JavascriptPromise::WillRejectionBeUnhandled()
    {
        bool willBeUnhandled = !this->GetIsHandled();
        if (!willBeUnhandled)
        {
            // if this promise is handled, then we need to do a depth-first search over this promise's reject
            // reactions. If we find a reaction that
            //    - associated promise is "unhandled" (ie, it's never been "then'd")
            //    - AND its rejection handler is our default "thrower function"
            // then this promise results in an unhandled rejection path.

            JsUtil::Stack<JavascriptPromise*, HeapAllocator> stack(&HeapAllocator::Instance);
            SimpleHashTable<JavascriptPromise*, int, HeapAllocator> visited(&HeapAllocator::Instance);
            stack.Push(this);
            visited.Add(this, 1);

            while (!willBeUnhandled && !stack.Empty())
            {
                JavascriptPromise * curr = stack.Pop();
                {
                    JavascriptPromiseReactionList* reactions = curr->GetReactions();
                    JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
                    while (it.Next())
                    {
                        JavascriptPromiseReactionPair pair = it.Data();
                        JavascriptPromiseReaction* reaction = pair.rejectReaction;
                        Var promiseVar = reaction->GetCapabilities()->GetPromise();

                        if (VarIs<JavascriptPromise>(promiseVar))
                        {
                            JavascriptPromise* p = VarTo<JavascriptPromise>(promiseVar);
                            if (!p->GetIsHandled())
                            {
                                RecyclableObject* handler = reaction->GetHandler();
                                if (VarIs<JavascriptFunction>(handler))
                                {
                                    JavascriptFunction* func = VarTo<JavascriptFunction>(handler);
                                    FunctionInfo* functionInfo = func->GetFunctionInfo();

#ifdef DEBUG
                                    if (!func->IsCrossSiteObject())
                                    {
                                        // assert that Thrower function's FunctionInfo hasn't changed
                                        AssertMsg(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower, "unexpected FunctionInfo for thrower function!");
                                    }
#endif

                                    // If the function info is the default thrower function's function info, then assume that this is unhandled
                                    // this will work across script contexts
                                    if (functionInfo == &JavascriptPromise::EntryInfo::Thrower)
                                    {
                                        willBeUnhandled = true;
                                        break;
                                    }
                                }
                            }
                            AssertMsg(visited.HasEntry(p) == false, "Unexpected cycle in promise reaction tree!");
                            if (!visited.HasEntry(p))
                            {
                                stack.Push(p);
                                visited.Add(p, 1);
                            }
                        }
                    }
                }
            }
        }
        return willBeUnhandled;
    }